

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Set
          (RepeatedField<unsigned_long> *this,int index,unsigned_long *value)

{
  unsigned_long uVar1;
  LogMessage *pLVar2;
  unsigned_long *puVar3;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x52c);
    pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(&local_29,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x52d);
    pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_29,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
  }
  uVar1 = *value;
  puVar3 = elements(this);
  puVar3[index] = uVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Set(int index, const Element& value) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  elements()[index] = value;
}